

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O1

LY_ERR lys_feature_value(lys_module *module,char *feature)

{
  lysp_module *pmod;
  size_t len;
  lysp_feature *plVar1;
  char *pcVar2;
  
  if (module == (lys_module *)0x0) {
    pcVar2 = "module";
  }
  else {
    pmod = module->parsed;
    if (pmod == (lysp_module *)0x0) {
      pcVar2 = "module->parsed";
    }
    else {
      if (feature != (char *)0x0) {
        len = strlen(feature);
        plVar1 = lysp_feature_find(pmod,feature,len,'\0');
        if (plVar1 == (lysp_feature *)0x0) {
          return LY_ENOTFOUND;
        }
        if ((plVar1->flags & 0x20) != 0) {
          return LY_SUCCESS;
        }
        return LY_ENOT;
      }
      pcVar2 = "feature";
    }
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"lys_feature_value");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_feature_value(const struct lys_module *module, const char *feature)
{
    const struct lysp_feature *f;

    LY_CHECK_ARG_RET(NULL, module, module->parsed, feature, LY_EINVAL);

    /* search for the specified feature */
    f = lysp_feature_find(module->parsed, feature, strlen(feature), 0);
    LY_CHECK_RET(!f, LY_ENOTFOUND);

    /* feature disabled */
    if (!(f->flags & LYS_FENABLED)) {
        return LY_ENOT;
    }

    /* feature enabled */
    return LY_SUCCESS;
}